

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O1

void Fra_ManClean(Fra_Man_t *p,int nNodesMax)

{
  Vec_Ptr_t *__ptr;
  int iVar1;
  Vec_Ptr_t **ppVVar2;
  int *piVar3;
  size_t sVar4;
  long lVar5;
  
  iVar1 = p->nMemAlloc;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      __ptr = p->pMemFanins[lVar5];
      if ((Vec_Ptr_t *)0x1 < __ptr) {
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
          __ptr->pArray = (void **)0x0;
        }
        if (__ptr != (Vec_Ptr_t *)0x0) {
          free(__ptr);
        }
      }
      lVar5 = lVar5 + 1;
      iVar1 = p->nMemAlloc;
    } while (lVar5 < iVar1);
  }
  if (iVar1 < nNodesMax) {
    sVar4 = (long)nNodesMax * 8 + 40000;
    if (p->pMemFanins == (Vec_Ptr_t **)0x0) {
      ppVVar2 = (Vec_Ptr_t **)malloc(sVar4);
    }
    else {
      ppVVar2 = (Vec_Ptr_t **)realloc(p->pMemFanins,sVar4);
    }
    p->pMemFanins = ppVVar2;
    sVar4 = (long)(nNodesMax + 5000) << 2;
    if (p->pMemSatNums == (int *)0x0) {
      piVar3 = (int *)malloc(sVar4);
    }
    else {
      piVar3 = (int *)realloc(p->pMemSatNums,sVar4);
    }
    p->pMemSatNums = piVar3;
    p->nMemAlloc = nNodesMax + 5000;
  }
  memset(p->pMemFanins,0,(long)p->nMemAlloc << 3);
  memset(p->pMemSatNums,0,(long)p->nMemAlloc << 2);
  return;
}

Assistant:

void Fra_ManClean( Fra_Man_t * p, int nNodesMax )
{
    int i;
    // remove old arrays
    for ( i = 0; i < p->nMemAlloc; i++ )
        if ( p->pMemFanins[i] && p->pMemFanins[i] != (void *)1 )
            Vec_PtrFree( p->pMemFanins[i] );
    // realloc for the new size
    if ( p->nMemAlloc < nNodesMax )
    {
        int nMemAllocNew = nNodesMax + 5000;
        p->pMemFanins = ABC_REALLOC( Vec_Ptr_t *, p->pMemFanins, nMemAllocNew );
        p->pMemSatNums = ABC_REALLOC( int, p->pMemSatNums, nMemAllocNew );
        p->nMemAlloc = nMemAllocNew;
    }
    // prepare for the new run
    memset( p->pMemFanins, 0, sizeof(Vec_Ptr_t *) * p->nMemAlloc );
    memset( p->pMemSatNums, 0, sizeof(int) * p->nMemAlloc );
}